

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseTwoCharToken(State *state,char *two_char_token)

{
  char *pcVar1;
  
  pcVar1 = state->mangled_cur;
  if ((*pcVar1 == *two_char_token) && (pcVar1[1] == two_char_token[1])) {
    state->mangled_cur = pcVar1 + 2;
    return true;
  }
  return false;
}

Assistant:

static bool ParseTwoCharToken(State *state, const char *two_char_token) {
  if (state->mangled_cur[0] == two_char_token[0] &&
      state->mangled_cur[1] == two_char_token[1]) {
    state->mangled_cur += 2;
    return true;
  }
  return false;
}